

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O1

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove_any(map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d,range *r)

{
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unsigned_long *puVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  fatal_error *this_01;
  ostringstream dlib_o_out;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  iVar2 = (*(this->
            super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
            ._vptr_enumerable[8])();
  if ((d != (domain *)r) && (CONCAT44(extraout_var,iVar2) != 0)) {
    this_00 = &(this->
               super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               ).bst;
    binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::remove_least_element_in_tree
              (this_00,(this->
                       super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                       ).bst.tree_root,d,r);
    puVar1 = &(this->
              super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ).bst.tree_size;
    *puVar1 = *puVar1 - 1;
    (*(this->
      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      ).bst.
      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
      ._vptr_enumerable[3])(this_00);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,0x8e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/logger/../threads/../map/map_kernel_c.h"
             ,0x74);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "virtual void dlib::map_kernel_c<dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>>::remove_any(domain &, range &) [map_base = dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>]"
             ,0x29a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "(this->size() > 0) && (static_cast<void*>(&d) != static_cast<void*>(&r))",0x48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\tvoid map::remove_any",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\n\tsize() must be greater than zero if something is going to be removed",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\n\tand d and r must not be the same variable.",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n\tsize(): ",10);
  (*(this->
    super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ).
    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
    ._vptr_enumerable[8])(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tthis:   ",10);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\t&d:     ",10);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\t&r:     ",10);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  this_01 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_01,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(this_01,&fatal_error::typeinfo,error::~error);
}

Assistant:

void map_kernel_c<map_base>::
    remove_any (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0)  &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tand d and r must not be the same variable."
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            << "\n\t&d:     " << static_cast<void*>(&d)
            << "\n\t&r:     " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::remove_any(d,r);
    }